

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O2

uint socket_get_port(int socket)

{
  int iVar1;
  uint uVar2;
  socklen_t len;
  sockaddr_storage sa;
  socklen_t local_84;
  sockaddr local_80 [8];
  
  local_84 = 0x80;
  iVar1 = getsockname(socket,local_80,&local_84);
  if ((iVar1 < 0) || ((local_80[0].sa_family != 2 && (local_80[0].sa_family != 10)))) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(ushort)(local_80[0].sa_data._0_2_ << 8 | (ushort)local_80[0].sa_data._0_2_ >> 8);
  }
  return uVar2;
}

Assistant:

unsigned int socket_get_port(int socket)
{
    struct sockaddr_storage sa;
    socklen_t len = sizeof(sa);
    if (getsockname(socket, (struct sockaddr *)&sa, &len) < 0)
        return 0;

    if (sa.ss_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)&sa;
        return ntohs(sa6->sin6_port);
    }
    else if (sa.ss_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)&sa;
        return ntohs(sa4->sin_port);
    }
    else
        return 0;
}